

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O0

void __thiscall DistanceComp::setSampleCount(DistanceComp *this,size_t new_size)

{
  unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_> *in_RSI;
  unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_> *in_RDI;
  unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
  *in_stack_ffffffffffffffd8;
  
  al::FlexArray<float,_16UL>::Create(new_size);
  std::unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>::
  operator=(in_RDI,in_stack_ffffffffffffffd8);
  std::unique_ptr<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>::
  ~unique_ptr(in_RSI);
  return;
}

Assistant:

void setSampleCount(size_t new_size)
    { mSamples = FloatArray::Create(new_size); }